

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O2

void rb_remove_node(lyd_meta *root_meta,rb_node **rbt,lyd_node *node,rb_node **removed)

{
  lysc_ext_instance *plVar1;
  rb_node *prVar2;
  int iVar3;
  lysc_type_bitenum_item *rbn;
  lysc_type_bitenum_item *plVar4;
  rb_node *prVar5;
  rb_node *prVar6;
  uint8_t uVar7;
  long lVar8;
  code *pcVar9;
  rb_node **pprVar10;
  rb_node *prVar11;
  rb_node *rbn_00;
  
  if (((root_meta == (lyd_meta *)0x0) || (rbt == (rb_node **)0x0)) || (node == (lyd_node *)0x0)) {
    __assert_fail("root_meta && rbt && node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0x3be,
                  "void rb_remove_node(struct lyd_meta *, struct rb_node **, struct lyd_node *, struct rb_node **)"
                 );
  }
  plVar4 = (lysc_type_bitenum_item *)*rbt;
  if (plVar4 == (lysc_type_bitenum_item *)0x0) {
    return;
  }
  rbn = plVar4;
  if (plVar4->exts != (lysc_ext_instance *)node) {
    pcVar9 = rb_compare_lists;
    if (((lysc_node *)plVar4->exts->argument)->nodetype == 8) {
      pcVar9 = rb_compare_leaflists;
    }
    while( true ) {
      iVar3 = (*pcVar9)(plVar4->exts,node);
      lVar8 = 8;
      if ((iVar3 < 1) && (lVar8 = 0x10, -1 < iVar3)) break;
      plVar4 = *(lysc_type_bitenum_item **)((long)&plVar4->name + lVar8);
      if (plVar4 == (lysc_type_bitenum_item *)0x0) {
        return;
      }
    }
    plVar1 = plVar4->exts;
    rbn = plVar4;
    while (plVar1 != (lysc_ext_instance *)node) {
      rbn = (lysc_type_bitenum_item *)rb_prev((rb_node *)rbn);
      if ((rbn == (lysc_type_bitenum_item *)0x0) || (iVar3 = (*pcVar9)(rbn->exts,node), iVar3 != 0))
      goto LAB_00151fcb;
      plVar1 = rbn->exts;
    }
  }
LAB_00151f00:
  prVar5 = (rb_node *)rbn->ref;
  if ((rb_node *)rbn->dsc == (rb_node *)0x0) {
    rbn_00 = (rb_node *)rbn->name;
    uVar7 = *(uint8_t *)&rbn->field_4;
    if (prVar5 != (rb_node *)0x0) goto LAB_00151fbe;
    prVar5 = (rb_node *)0x0;
  }
  else {
    if (prVar5 != (rb_node *)0x0) {
      do {
        prVar11 = prVar5;
        prVar5 = prVar11->left;
      } while (prVar11->left != (rb_node *)0x0);
      rbn_00 = prVar11->parent;
      prVar5 = prVar11->right;
      uVar7 = prVar11->color;
      if (prVar5 != (rb_node *)0x0) {
        prVar5->parent = rbn_00;
      }
      pprVar10 = rbt;
      if (rbn_00 != (rb_node *)0x0) {
        pprVar10 = &rbn_00->right;
        if (rbn_00->left == prVar11) {
          pprVar10 = &rbn_00->left;
        }
      }
      *pprVar10 = prVar5;
      if ((lysc_type_bitenum_item *)prVar11->parent == rbn) {
        rbn_00 = prVar11;
      }
      prVar6 = (rb_node *)rbn->name;
      prVar11->parent = prVar6;
      prVar2 = (rb_node *)rbn->ref;
      prVar11->left = (rb_node *)rbn->dsc;
      prVar11->right = prVar2;
      prVar11->color = *(uint8_t *)&rbn->field_4;
      pprVar10 = rbt;
      if (prVar6 != (rb_node *)0x0) {
        pprVar10 = &prVar6->right;
        if ((lysc_type_bitenum_item *)prVar6->left == rbn) {
          pprVar10 = &prVar6->left;
        }
      }
      *pprVar10 = prVar11;
      ((rb_node *)rbn->dsc)->parent = prVar11;
      if ((rb_node *)rbn->ref != (rb_node *)0x0) {
        ((rb_node *)rbn->ref)->parent = prVar11;
      }
      goto LAB_0015201f;
    }
    rbn_00 = (rb_node *)rbn->name;
    uVar7 = *(uint8_t *)&rbn->field_4;
    prVar5 = (rb_node *)rbn->dsc;
LAB_00151fbe:
    prVar5->parent = rbn_00;
  }
  if (rbn_00 == (rb_node *)0x0) {
    *rbt = prVar5;
    rbn_00 = (rb_node *)0x0;
  }
  else if ((lysc_type_bitenum_item *)rbn_00->left == rbn) {
    rbn_00->left = prVar5;
  }
  else {
    rbn_00->right = prVar5;
  }
LAB_0015201f:
  if (uVar7 == '\0') {
    while( true ) {
      if ((prVar5 != (rb_node *)0x0) && (prVar5->color != '\0')) goto LAB_00152184;
      if ((prVar5 == *rbt) || (rbn_00 == (rb_node *)0x0)) goto LAB_0015217f;
      prVar11 = rbn_00->left;
      if (prVar11 == prVar5) {
        prVar11 = rbn_00->right;
        if (prVar11->color == '\x01') {
          prVar11->color = '\0';
          rbn_00->color = '\x01';
          rb_rotate_left(rbt,rbn_00);
          prVar11 = rbn_00->right;
        }
        prVar5 = prVar11->left;
        if ((prVar5 == (rb_node *)0x0) || (prVar5->color == '\0')) {
          prVar6 = prVar11->right;
          if ((prVar6 == (rb_node *)0x0) || (prVar6->color == '\0')) goto LAB_001520cd;
        }
        else {
          prVar6 = prVar11->right;
          if ((prVar6 == (rb_node *)0x0) || (prVar6->color == '\0')) {
            prVar5->color = '\0';
            prVar11->color = '\x01';
            rb_rotate_right(rbt,prVar11);
            prVar11 = rbn_00->right;
            prVar6 = prVar11->right;
          }
        }
        prVar11->color = rbn_00->color;
        rbn_00->color = '\0';
        if (prVar6 != (rb_node *)0x0) {
          prVar6->color = '\0';
        }
        rb_rotate_left(rbt,rbn_00);
        goto LAB_0015217c;
      }
      if (prVar11->color == '\x01') {
        prVar11->color = '\0';
        rbn_00->color = '\x01';
        rb_rotate_right(rbt,rbn_00);
        prVar11 = rbn_00->left;
      }
      prVar5 = prVar11->left;
      if ((prVar5 != (rb_node *)0x0) && (prVar5->color != '\0')) goto LAB_00152113;
      prVar6 = prVar11->right;
      if ((prVar6 != (rb_node *)0x0) && (prVar6->color != '\0')) break;
LAB_001520cd:
      prVar11->color = '\x01';
      prVar5 = rbn_00;
      rbn_00 = rbn_00->parent;
    }
    if ((prVar5 == (rb_node *)0x0) || (prVar5->color == '\0')) {
      prVar6->color = '\0';
      prVar11->color = '\x01';
      rb_rotate_left(rbt,prVar11);
      prVar11 = rbn_00->left;
      prVar5 = prVar11->left;
    }
LAB_00152113:
    prVar11->color = rbn_00->color;
    rbn_00->color = '\0';
    if (prVar5 != (rb_node *)0x0) {
      prVar5->color = '\0';
    }
    rb_rotate_right(rbt,rbn_00);
LAB_0015217c:
    prVar5 = *rbt;
LAB_0015217f:
    if (prVar5 != (rb_node *)0x0) {
LAB_00152184:
      prVar5->color = '\0';
    }
  }
  *removed = (rb_node *)rbn;
  plVar4 = (lysc_type_bitenum_item *)*rbt;
  if (rbn == plVar4) {
    *rbt = (rb_node *)0x0;
    plVar4 = (lysc_type_bitenum_item *)0x0;
  }
  (root_meta->value).field_2.enum_item = plVar4;
  return;
LAB_00151fcb:
  do {
    plVar4 = (lysc_type_bitenum_item *)rb_next((rb_node *)plVar4);
    if (plVar4 == (lysc_type_bitenum_item *)0x0) {
      return;
    }
    iVar3 = (*pcVar9)(plVar4->exts,node);
    if (iVar3 != 0) {
      return;
    }
    rbn = plVar4;
  } while (plVar4->exts != (lysc_ext_instance *)node);
  goto LAB_00151f00;
}

Assistant:

static void
rb_remove_node(struct lyd_meta *root_meta, struct rb_node **rbt, struct lyd_node *node, struct rb_node **removed)
{
    struct rb_node *rbn;

    assert(root_meta && rbt && node);

    if (!*rbt) {
        return;
    }

    /* find @p node in the Red-black tree. */
    rbn = rb_find(*rbt, node);
    if (!rbn) {
        /* node was not inserted to the lyds tree due to optimization */
        return;
    }
    assert(RBN_DNODE(rbn) == node);

    /* remove node */
    rbn = rb_remove(rbt, rbn);
    *removed = rbn;
    if (rbn == *rbt) {
        /* rbn was the last node, assurance that root will be set to NULL */
        *rbt = NULL;
    }

    /* the root of the Red-black tree may changed due to removal, so update the pointer to the root */
    RBT_SET(root_meta, *rbt);
}